

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O1

Point3f __thiscall pbrt::Interaction::OffsetRayOrigin(Interaction *this,Vector3f *w)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  ulong uVar6;
  float fVar8;
  undefined8 uVar9;
  bool bVar10;
  ulong uVar11;
  int iVar12;
  float *pfVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Point3f PVar26;
  float local_c;
  undefined8 local_8;
  
  fVar2 = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  fVar14 = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
  ;
  fVar3 = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
  fVar4 = (this->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
  uVar11._0_4_ = (this->n).super_Tuple3<pbrt::Normal3,_float>.x;
  uVar11._4_4_ = (this->n).super_Tuple3<pbrt::Normal3,_float>.y;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar11;
  fVar15 = (this->n).super_Tuple3<pbrt::Normal3,_float>.z;
  uVar5 = (w->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar7 = (w->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar17._4_4_ = uVar7;
  auVar17._0_4_ = uVar5;
  auVar17._8_8_ = 0;
  fVar18 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar22._8_4_ = 0x7fffffff;
  auVar22._0_8_ = 0x7fffffff7fffffff;
  auVar22._12_4_ = 0x7fffffff;
  auVar19 = vandps_avx(auVar24,auVar22);
  auVar20 = vmovshdup_avx(auVar24);
  auVar16 = vandps_avx(auVar20,auVar22);
  auVar22 = vandps_avx(ZEXT416((uint)fVar15),auVar22);
  fVar8 = (fVar4 - fVar3) * 0.5;
  auVar25 = ZEXT416((uint)(fVar8 * auVar22._0_4_));
  auVar21 = vfmsub213ss_fma(ZEXT416((uint)fVar8),auVar22,auVar25);
  auVar22 = vmovshdup_avx(auVar17);
  auVar23 = ZEXT416((uint)(fVar15 * fVar18));
  auVar22 = vfmadd213ss_fma(auVar22,auVar20,auVar23);
  auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)fVar15),auVar23);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ + auVar20._0_4_)),auVar24,auVar17);
  auVar17 = ZEXT816(0) << 0x20;
  uVar6 = *(ulong *)&(this->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar6;
  auVar22 = vmovshdup_avx(auVar23);
  auVar16 = vfmadd213ss_fma(ZEXT416((uint)((fVar14 - auVar22._0_4_) * 0.5)),auVar16,auVar25);
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ + auVar16._0_4_)),auVar19,
                            ZEXT416((uint)(((float)uVar6 - fVar2) * 0.5)));
  fVar18 = auVar19._0_4_;
  auVar19._0_4_ = (float)(undefined4)uVar11 * fVar18;
  auVar19._4_4_ = (float)uVar11._4_4_ * fVar18;
  auVar19._8_4_ = fVar18 * 0.0;
  auVar19._12_4_ = fVar18 * 0.0;
  uVar9 = vcmpss_avx512f(auVar20,auVar17,1);
  bVar10 = (bool)((byte)uVar9 & 1);
  fVar15 = (float)((uint)bVar10 * (int)-(fVar15 * fVar18) + (uint)!bVar10 * (int)(fVar15 * fVar18));
  if (auVar20._0_4_ < 0.0) {
    uVar11 = CONCAT44(auVar19._4_4_,auVar19._0_4_);
    auVar19._0_8_ = uVar11 ^ 0x8000000080000000;
    auVar19._8_4_ = -auVar19._8_4_;
    auVar19._12_4_ = -auVar19._12_4_;
  }
  auVar16 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar14),0x10);
  auVar20._0_4_ = (float)uVar6 + auVar16._0_4_;
  auVar20._4_4_ = (float)(uVar6 >> 0x20) + auVar16._4_4_;
  auVar20._8_4_ = auVar16._8_4_ + 0.0;
  auVar20._12_4_ = auVar16._12_4_ + 0.0;
  auVar16._8_4_ = 0x3f000000;
  auVar16._0_8_ = 0x3f0000003f000000;
  auVar16._12_4_ = 0x3f000000;
  auVar16 = vmulps_avx512vl(auVar20,auVar16);
  fVar2 = auVar19._0_4_;
  auVar21._0_4_ = auVar16._0_4_ + fVar2;
  auVar21._4_4_ = auVar16._4_4_ + auVar19._4_4_;
  auVar21._8_4_ = auVar16._8_4_ + auVar19._8_4_;
  auVar21._12_4_ = auVar16._12_4_ + auVar19._12_4_;
  pfVar1 = (float *)((long)&local_8 + 4);
  local_8 = vmovlps_avx(auVar21);
  local_c = (fVar3 + fVar4) * 0.5 + fVar15;
  auVar19 = vmovshdup_avx(auVar19);
  iVar12 = 0;
  do {
    fVar14 = fVar2;
    if ((iVar12 != 0) && (fVar14 = auVar19._0_4_, iVar12 != 1)) {
      fVar14 = fVar15;
    }
    if (fVar14 <= 0.0) {
      fVar14 = fVar2;
      if ((iVar12 != 0) && (fVar14 = auVar19._0_4_, iVar12 != 1)) {
        fVar14 = fVar15;
      }
      if (fVar14 < 0.0) {
        pfVar13 = (float *)&local_8;
        if ((iVar12 != 0) && (pfVar13 = pfVar1, iVar12 != 1)) {
          pfVar13 = &local_c;
        }
        fVar14 = *pfVar13;
        if (-INFINITY < fVar14) {
          uVar9 = vcmpss_avx512f(ZEXT416((uint)fVar14),auVar17,0);
          bVar10 = (bool)((byte)uVar9 & 1);
          fVar14 = (float)((uint)bVar10 * -0x80000000 + (uint)!bVar10 * (int)fVar14);
          fVar14 = (float)((int)fVar14 + -1 + (uint)(fVar14 <= 0.0) * 2);
        }
        goto LAB_002cc7b2;
      }
    }
    else {
      pfVar13 = (float *)&local_8;
      if ((iVar12 != 0) && (pfVar13 = pfVar1, iVar12 != 1)) {
        pfVar13 = &local_c;
      }
      fVar14 = *pfVar13;
      if (fVar14 < INFINITY) {
        uVar9 = vcmpss_avx512f(ZEXT416((uint)fVar14),auVar17,0);
        fVar14 = (float)((uint)!(bool)((byte)uVar9 & 1) * (int)fVar14);
        fVar14 = (float)((-(uint)(fVar14 < 0.0) | 1) + (int)fVar14);
      }
LAB_002cc7b2:
      pfVar13 = (float *)&local_8;
      if ((iVar12 != 0) && (pfVar13 = pfVar1, iVar12 != 1)) {
        pfVar13 = &local_c;
      }
      *pfVar13 = fVar14;
    }
    iVar12 = iVar12 + 1;
    if (iVar12 == 3) {
      PVar26.super_Tuple3<pbrt::Point3,_float>.z = local_c;
      PVar26.super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)local_8;
      PVar26.super_Tuple3<pbrt::Point3,_float>.y = (float)local_8._4_4_;
      return (Point3f)PVar26.super_Tuple3<pbrt::Point3,_float>;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    Point3f OffsetRayOrigin(const Vector3f &w) const {
        return pbrt::OffsetRayOrigin(pi, n, w);
    }